

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create_table.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCreateTable *op)

{
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  *this_00;
  Catalog *pCVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  SchemaCatalogEntry *args_1;
  int iVar2;
  pointer pBVar3;
  pointer pCVar4;
  optional_ptr<duckdb::CatalogEntry,_true> oVar5;
  reference this_01;
  type op_00;
  PhysicalOperator *pPVar6;
  undefined4 extraout_var;
  pointer this_02;
  
  this_00 = &op->info;
  pBVar3 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator->(this_00);
  pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&pBVar3->base);
  pBVar3 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator->(this_00);
  oVar5 = Catalog::GetEntry((pBVar3->schema->super_InCatalogEntry).catalog,this->context,TABLE_ENTRY
                            ,&pCVar4->schema,(string *)(pCVar4 + 1),RETURN_NULL);
  pBVar3 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator->(this_00);
  pCVar4 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&pBVar3->base);
  if (((oVar5.ptr == (CatalogEntry *)0x0) || (pCVar4->on_conflict == REPLACE_ON_CONFLICT)) &&
     ((op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (op->super_LogicalOperator).children.
      super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this_01 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_01);
    pPVar6 = CreatePlan(this,op_00);
    pCVar1 = (op->schema->super_InCatalogEntry).catalog;
    UNRECOVERED_JUMPTABLE = pCVar1->_vptr_Catalog[0xb];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(pCVar1,this->context,this,op,pPVar6,UNRECOVERED_JUMPTABLE);
    return (PhysicalOperator *)CONCAT44(extraout_var,iVar2);
  }
  args_1 = op->schema;
  this_02 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
            operator->(&this->physical_plan);
  pPVar6 = PhysicalPlan::
           Make<duckdb::PhysicalCreateTable,duckdb::LogicalCreateTable&,duckdb::SchemaCatalogEntry&,duckdb::unique_ptr<duckdb::BoundCreateTableInfo,std::default_delete<duckdb::BoundCreateTableInfo>,true>,unsigned_long&>
                     (this_02,op,args_1,this_00,&(op->super_LogicalOperator).estimated_cardinality);
  return pPVar6;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCreateTable &op) {
	const auto &create_info = op.info->base->Cast<CreateTableInfo>();
	auto &catalog = op.info->schema.catalog;
	auto existing_entry = catalog.GetEntry(context, CatalogType::TABLE_ENTRY, create_info.schema, create_info.table,
	                                       OnEntryNotFound::RETURN_NULL);
	bool replace = op.info->Base().on_conflict == OnCreateConflict::REPLACE_ON_CONFLICT;
	if ((!existing_entry || replace) && !op.children.empty()) {
		auto &plan = CreatePlan(*op.children[0]);
		return op.schema.catalog.PlanCreateTableAs(context, *this, op, plan);
	}
	return Make<PhysicalCreateTable>(op, op.schema, std::move(op.info), op.estimated_cardinality);
}